

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,type param_3
          )

{
  io_context *in_RSI;
  undefined8 in_RDI;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *unaff_retaddr;
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI);
  return;
}

Assistant:

explicit basic_socket(ExecutionContext& context,
      typename constraint<
        is_convertible<ExecutionContext&, execution_context&>::value
      >::type = 0)
    : impl_(0, 0, context)
  {
  }